

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  Environment env;
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  VkDescriptorSetAllocateInfo local_330;
  Move<vk::Handle<(vk::HandleType)22>_> local_308;
  Move<vk::Handle<(vk::HandleType)22>_> local_2e8;
  VkDescriptorPool *local_2c8;
  DeviceInterface *pDStack_2c0;
  VkDevice local_2b8;
  deUint64 dStack_2b0;
  Move<vk::Handle<(vk::HandleType)22>_> local_2a8;
  Environment local_288;
  Resources local_250;
  Resources local_1c8;
  Resources local_140;
  Resources local_b8;
  
  local_288.vkp = context->m_platformInterface;
  pDVar1 = Context::getDeviceInterface(context);
  local_288.vkd = pDVar1;
  pVVar2 = Context::getDevice(context);
  local_288.device = pVVar2;
  local_288.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_288.programBinaries = context->m_progCollection;
  local_288.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_288.maxResourceConsumers = 1;
  DescriptorSet::Resources::Resources(&local_b8,&local_288,params);
  DescriptorSet::Resources::Resources(&local_140,&local_288,params);
  DescriptorSet::Resources::Resources(&local_1c8,&local_288,params);
  DescriptorSet::Resources::Resources(&local_250,&local_288,params);
  local_330.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_330.pNext = (void *)0x0;
  local_330.pSetLayouts = (VkDescriptorSetLayout *)&local_b8.descriptorSetLayout.object;
  local_330.descriptorPool.m_internal =
       local_b8.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  local_330.descriptorSetCount = 1;
  ::vk::allocateDescriptorSet(&local_2e8,pDVar1,pVVar2,&local_330);
  local_2c8 = (VkDescriptorPool *)
              local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  pDStack_2c0 = local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                m_deviceIface;
  local_2b8 = local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  dStack_2b0 = local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal;
  local_330.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_330.pNext = (void *)0x0;
  local_330.pSetLayouts = (VkDescriptorSetLayout *)&local_140.descriptorSetLayout.object;
  local_330.descriptorPool.m_internal =
       local_140.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  local_330.descriptorSetCount = 1;
  ::vk::allocateDescriptorSet(&local_308,pDVar1,pVVar2,&local_330);
  pVVar2 = local_288.device;
  pDVar1 = local_288.vkd;
  local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
  local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
  local_330.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_330.pNext = (void *)0x0;
  local_330.pSetLayouts = (VkDescriptorSetLayout *)&local_1c8.descriptorSetLayout.object;
  local_330.descriptorPool.m_internal =
       local_1c8.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  local_330.descriptorSetCount = 1;
  ::vk::allocateDescriptorSet(&local_2a8,local_288.vkd,local_288.device,&local_330);
  local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
  local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
  local_330.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_330.pNext = (void *)0x0;
  local_330.pSetLayouts = (VkDescriptorSetLayout *)&local_250.descriptorSetLayout.object;
  local_330.descriptorPool.m_internal =
       local_250.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  local_330.descriptorSetCount = 1;
  ::vk::allocateDescriptorSet(&local_2a8,pDVar1,pVVar2,&local_330);
  if (local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
    local_330._0_8_ =
         local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (*(local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ,local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               local_2a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal,1);
  }
  if (local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
    local_330._0_8_ =
         local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (*(local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ,local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               local_308.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal,1);
  }
  if (local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
    local_330._0_8_ =
         local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (*(local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ,local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               local_2e8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal,1);
  }
  if (local_2c8 != (VkDescriptorPool *)0x0) {
    local_330._0_8_ = local_2c8;
    (*pDStack_2c0->_vptr_DeviceInterface[0x3d])(pDStack_2c0,local_2b8,dStack_2b0,1);
  }
  local_330._0_8_ = &local_330.descriptorPool;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_330._0_8_,
             (long)local_330.pNext + local_330._0_8_);
  if ((VkDescriptorPool *)local_330._0_8_ != &local_330.descriptorPool) {
    operator_delete((void *)local_330._0_8_,local_330.descriptorPool.m_internal + 1);
  }
  DescriptorSet::Resources::~Resources(&local_250);
  DescriptorSet::Resources::~Resources(&local_1c8);
  DescriptorSet::Resources::~Resources(&local_140);
  DescriptorSet::Resources::~Resources(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}